

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_GLSL_DP2ADD(Context *ctx)

{
  char local_118 [8];
  char extra [64];
  char src2 [64];
  char src1 [64];
  char src0 [64];
  Context *ctx_local;
  
  make_GLSL_srcarg_string_vec2(ctx,0,src1 + 0x38,0x40);
  make_GLSL_srcarg_string_vec2(ctx,1,src2 + 0x38,0x40);
  make_GLSL_srcarg_string_scalar(ctx,2,extra + 0x38,0x40);
  snprintf(local_118,0x40," + %s",extra + 0x38);
  emit_GLSL_dotprod(ctx,src1 + 0x38,src2 + 0x38,local_118);
  return;
}

Assistant:

EMIT_GLSL_OPCODE_UNIMPLEMENTED_FUNC(BEM) // !!! FIXME

static void emit_GLSL_DP2ADD(Context *ctx)
{
    char src0[64]; make_GLSL_srcarg_string_vec2(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_GLSL_srcarg_string_vec2(ctx, 1, src1, sizeof (src1));
    char src2[64]; make_GLSL_srcarg_string_scalar(ctx, 2, src2, sizeof (src2));
    char extra[64]; snprintf(extra, sizeof (extra), " + %s", src2);
    emit_GLSL_dotprod(ctx, src0, src1, extra);
}